

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O1

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char8_t,_char8_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char8_t,_char8_t>_> *this)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  char32_t (*in_RDX) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  char8_t *pcVar5;
  char8_t *extraout_RDX_05;
  char8_t *extraout_RDX_06;
  char8_t *extraout_RDX_07;
  char8_t *extraout_RDX_08;
  char8_t *extraout_RDX_09;
  char8_t *extraout_RDX_10;
  char8_t *extraout_RDX_11;
  _Alloc_hider __s1;
  pointer *__ptr;
  _Alloc_hider _Var6;
  size_type __rlen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  pointer *__ptr_2;
  bool bVar7;
  decode_result dVar8;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_01;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_02;
  AssertionResult gtest_ar_;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> abcd_str;
  long *local_90;
  AssertHelper local_88 [8];
  char local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  long *local_70;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_68;
  long local_60 [2];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_50;
  
  jessilib::string_cast<char8_t,char32_t[5]>(&local_50,(jessilib *)L"ABCD",in_RDX);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_50._M_string_length;
  __s1._M_p = local_50._M_dataplus._M_p;
  pcVar1 = local_50._M_dataplus._M_p + local_50._M_string_length;
  local_70 = local_60;
  std::__cxx11::u8string::_M_construct<char8_t*>
            ((u8string *)&local_70,local_50._M_dataplus._M_p,pcVar1);
  plVar2 = local_70;
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           local_50._M_string_length;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._M_string_length
      == local_68._M_head_impl) {
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_50._M_string_length ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_80[0] = true;
    }
    else {
      iVar3 = bcmp(local_50._M_dataplus._M_p,local_70,local_50._M_string_length);
      local_80[0] = iVar3 == 0;
      pbVar4 = extraout_RDX;
    }
  }
  else {
    local_80[0] = false;
  }
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (plVar2 != local_60) {
    operator_delete(plVar2,local_60[0] + 1);
    pbVar4 = extraout_RDX_00;
  }
  if (local_80[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,local_80,
               "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9d,(char *)local_70);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    pbVar4 = extraout_RDX_01;
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
      pbVar4 = extraout_RDX_02;
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
      pbVar4 = extraout_RDX_03;
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    pbVar4 = extraout_RDX_04;
  }
  _Var6._M_p = local_50._M_dataplus._M_p;
  bVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_50._M_string_length ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar7) {
    in_string._M_str = (char8_t *)pbVar4;
    in_string._M_len = (size_t)local_50._M_dataplus._M_p;
    dVar8 = jessilib::decode_codepoint_utf8<char8_t>
                      ((jessilib *)local_50._M_string_length,in_string);
    pcVar5 = (char8_t *)dVar8.units;
    if (pcVar5 == (char8_t *)0x0) {
      bVar7 = false;
    }
    else {
      do {
        local_50._M_string_length = local_50._M_string_length - (long)pcVar5;
        bVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_50._M_string_length ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar7) break;
        _Var6._M_p = _Var6._M_p + (long)pcVar5;
        in_string_00._M_str = pcVar5;
        in_string_00._M_len = (size_t)_Var6._M_p;
        dVar8 = jessilib::decode_codepoint_utf8<char8_t>
                          ((jessilib *)local_50._M_string_length,in_string_00);
        pcVar5 = (char8_t *)dVar8.units;
      } while (pcVar5 != (char8_t *)0x0);
    }
  }
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80[0] = bVar7;
  if (bVar7 == false) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,local_80,"is_valid(abcd_str)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x9e,(char *)local_70);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  local_70 = local_60;
  std::__cxx11::u8string::_M_construct<char8_t_const*>((u8string *)&local_70,__s1._M_p,pcVar1);
  plVar2 = local_70;
  pcVar5 = extraout_RDX_05;
  if (local_68._M_head_impl == this_00) {
    if (this_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_80[0] = true;
    }
    else {
      iVar3 = bcmp(__s1._M_p,local_70,(size_t)this_00);
      local_80[0] = iVar3 == 0;
      pcVar5 = extraout_RDX_06;
    }
  }
  else {
    local_80[0] = false;
  }
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (plVar2 != local_60) {
    operator_delete(plVar2,local_60[0] + 1);
    pcVar5 = extraout_RDX_07;
  }
  if (local_80[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,local_80,
               "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
               ,"false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa1,(char *)local_70);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    pcVar5 = extraout_RDX_08;
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
      pcVar5 = extraout_RDX_09;
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
      pcVar5 = extraout_RDX_10;
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
    pcVar5 = extraout_RDX_11;
  }
  bVar7 = this_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar7) {
    in_string_01._M_str = pcVar5;
    in_string_01._M_len = (size_t)__s1._M_p;
    dVar8 = jessilib::decode_codepoint_utf8<char8_t>((jessilib *)this_00,in_string_01);
    pcVar5 = (char8_t *)dVar8.units;
    if (pcVar5 == (char8_t *)0x0) {
      bVar7 = false;
    }
    else {
      do {
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)this_00 - (long)pcVar5);
        bVar7 = this_00 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar7) break;
        __s1._M_p = __s1._M_p + (long)pcVar5;
        in_string_02._M_str = pcVar5;
        in_string_02._M_len = (size_t)__s1._M_p;
        dVar8 = jessilib::decode_codepoint_utf8<char8_t>((jessilib *)this_00,in_string_02);
        pcVar5 = (char8_t *)dVar8.units;
      } while (pcVar5 != (char8_t *)0x0);
    }
  }
  local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_80[0] = bVar7;
  if (bVar7 == false) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_70,local_80,"is_valid(abcd_string_view)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0xa2,(char *)local_70);
    testing::internal::AssertHelper::operator=(local_88,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_88);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      (**(code **)(*local_90 + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}